

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_sparse.c
# Opt level: O3

int Test_SUNSparseMatrixToCSC(SUNMatrix A)

{
  int iVar1;
  undefined8 uVar2;
  SUNMatrix csr;
  SUNMatrix csc;
  SUNMatrix local_18;
  undefined8 local_10;
  
  local_10 = 0;
  local_18 = (SUNMatrix)0x0;
  iVar1 = SUNSparseMatrix_ToCSC();
  if (iVar1 == 0) {
    iVar1 = SUNSparseMatrix_ToCSR(local_10,&local_18);
    if (iVar1 == 0) {
      iVar1 = check_matrix(A,local_18,4.440892098500626e-14);
      if (iVar1 == 0) {
        puts("    PASSED test -- SUNSparseMatrixToCSC");
        SUNMatDestroy(local_18);
        iVar1 = 0;
        uVar2 = local_10;
        goto LAB_00103e4c;
      }
      puts(">>> FAILED test --  Test_SUNSparseMatrixToCSC check_martrix failed");
      SUNMatDestroy(local_18);
    }
    else {
      puts(">>> FAILED test -- SUNSparseMatrix_ToCSR returned nonzero");
    }
    iVar1 = 1;
    uVar2 = local_10;
  }
  else {
    puts(">>> FAILED test -- SUNSparseMatrix_ToCSC returned nonzero");
    iVar1 = 1;
    uVar2 = 0;
  }
LAB_00103e4c:
  SUNMatDestroy(uVar2);
  return iVar1;
}

Assistant:

int Test_SUNSparseMatrixToCSC(SUNMatrix A)
{
  int failure;
  SUNMatrix csc = NULL, csr = NULL;
  sunrealtype tol = 200 * SUN_UNIT_ROUNDOFF;

  failure = SUNSparseMatrix_ToCSC(A, &csc);

  if (failure)
  {
    printf(">>> FAILED test -- SUNSparseMatrix_ToCSC returned nonzero\n");
    SUNMatDestroy(csr);
    return (1);
  }

  /* check entries */
  if (SUNSparseMatrix_ToCSR(csc, &csr))
  {
    printf(">>> FAILED test -- SUNSparseMatrix_ToCSR returned nonzero\n");
    SUNMatDestroy(csc);
    return (1);
  }

  if (check_matrix(A, csr, tol))
  {
    printf(
      ">>> FAILED test --  Test_SUNSparseMatrixToCSC check_martrix failed\n");
    SUNMatDestroy(csr);
    SUNMatDestroy(csc);
    return (1);
  }

  printf("    PASSED test -- SUNSparseMatrixToCSC\n");

  SUNMatDestroy(csr);
  SUNMatDestroy(csc);

  return (0);
}